

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.hh
# Opt level: O0

string * phosg::Arguments::exc_prefix(string *__return_storage_ptr__,string *name)

{
  allocator<char> local_1a;
  undefined1 local_19;
  string *local_18;
  string *name_local;
  string *ret;
  
  local_19 = 0;
  local_18 = name;
  name_local = __return_storage_ptr__;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"(",&local_1a);
  ::std::allocator<char>::~allocator(&local_1a);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (__return_storage_ptr__,local_18);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (__return_storage_ptr__,") ");
  return __return_storage_ptr__;
}

Assistant:

static inline std::string exc_prefix(const std::string& name) {
    std::string ret = "(";
    ret += name;
    ret += ") ";
    return ret;
  }